

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_reshape(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  _Bool _Var1;
  int64_t iVar2;
  int64_t iVar3;
  ggml_tensor *tensor;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  size_t in_stack_00000190;
  ggml_tensor *in_stack_00000198;
  int64_t *in_stack_000001a0;
  int in_stack_000001a8;
  ggml_type in_stack_000001ac;
  ggml_context *in_stack_000001b0;
  
  _Var1 = ggml_is_contiguous((ggml_tensor *)0x14db6d);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xbf7,"GGML_ASSERT(%s) failed","ggml_is_contiguous(a)");
  }
  iVar2 = ggml_nelements(in_RSI);
  iVar3 = ggml_nelements(in_RDX);
  if (iVar2 != iVar3) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xbf9,"GGML_ASSERT(%s) failed","ggml_nelements(a) == ggml_nelements(b)");
  }
  tensor = ggml_new_tensor_impl
                     (in_stack_000001b0,in_stack_000001ac,in_stack_000001a8,in_stack_000001a0,
                      in_stack_00000198,in_stack_00000190);
  ggml_format_name(tensor,"%s (reshaped)",in_RSI->name);
  tensor->op = GGML_OP_RESHAPE;
  tensor->src[0] = in_RSI;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_reshape(
        struct ggml_context * ctx,
        struct ggml_tensor * a,
        struct ggml_tensor * b) {
    GGML_ASSERT(ggml_is_contiguous(a));
    // as only the shape of b is relevant, and not its memory layout, b is allowed to be non contiguous.
    GGML_ASSERT(ggml_nelements(a) == ggml_nelements(b));

    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, GGML_MAX_DIMS, b->ne, a, 0);
    ggml_format_name(result, "%s (reshaped)", a->name);

    result->op     = GGML_OP_RESHAPE;
    result->src[0] = a;

    return result;
}